

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_response.cpp
# Opt level: O2

string * HTTPResponse::date_abi_cxx11_(void)

{
  tm *ptVar1;
  string *in_RDI;
  time_t now;
  tm tm;
  char buf [128];
  allocator local_e1;
  time_t local_e0;
  tm local_d8;
  char local_98 [136];
  
  local_e0 = time((time_t *)0x0);
  ptVar1 = gmtime(&local_e0);
  local_d8.tm_sec = ptVar1->tm_sec;
  local_d8.tm_min = ptVar1->tm_min;
  local_d8.tm_hour = ptVar1->tm_hour;
  local_d8.tm_mday = ptVar1->tm_mday;
  local_d8.tm_mon = ptVar1->tm_mon;
  local_d8.tm_year = ptVar1->tm_year;
  local_d8.tm_wday = ptVar1->tm_wday;
  local_d8.tm_yday = ptVar1->tm_yday;
  local_d8.tm_isdst = ptVar1->tm_isdst;
  local_d8._36_4_ = *(undefined4 *)&ptVar1->field_0x24;
  local_d8.tm_gmtoff = ptVar1->tm_gmtoff;
  local_d8.tm_zone = ptVar1->tm_zone;
  strftime(local_98,0x80,"%a, %d %b %Y %H:%M:%S %Z",&local_d8);
  std::__cxx11::string::string((string *)in_RDI,local_98,&local_e1);
  return in_RDI;
}

Assistant:

std::string HTTPResponse::date() {
    char buf[128];
    time_t now = time(0);
    struct tm tm = *gmtime(&now);
    strftime(buf, sizeof(buf), "%a, %d %b %Y %H:%M:%S %Z", &tm);
    return std::string(buf);
}